

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O3

Vec3 __thiscall cert::World::light_hit(World *this,Vec3 point,Vec3 normal)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Light *pLVar3;
  Shape *pSVar4;
  uint uVar5;
  int iVar6;
  float extraout_var;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  undefined8 extraout_XMM0_Qa;
  double dVar10;
  undefined1 auVar11 [16];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  Vec3 VVar17;
  float local_b4;
  undefined8 local_b0;
  float local_a8;
  float local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_70;
  float local_68;
  undefined8 local_64;
  float local_5c;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  
  local_90 = normal.z;
  local_98 = normal._0_8_;
  local_a8 = point.z;
  local_b0 = point._0_8_;
  if ((this->lights).m_size == 0) {
    local_b4 = 0.0;
    local_88 = 0;
  }
  else {
    local_88 = 0;
    uStack_80 = 0;
    local_b4 = 0.0;
    uVar7 = 0;
    do {
      pLVar3 = (this->lights).m_data[uVar7];
      uVar5 = (*pLVar3->_vptr_Light[2])(pLVar3,&local_b0,&local_98);
      if ((uVar5 & 1) != 0) {
        pLVar3 = (this->lights).m_data[uVar7];
        fVar14 = (pLVar3->position).x - (float)local_b0;
        fVar15 = (pLVar3->position).y - local_b0._4_4_;
        fVar9 = (pLVar3->position).z - local_a8;
        local_58 = extraout_XMM0_Qa;
        dVar10 = sqrt((double)(ulong)(uint)(fVar9 * fVar9 + fVar14 * fVar14 + fVar15 * fVar15));
        local_9c = SUB84(dVar10,0);
        pLVar3 = (this->lights).m_data[uVar7];
        local_a0 = (pLVar3->position).z - local_a8;
        uVar1 = (pLVar3->position).x;
        uVar2 = (pLVar3->position).y;
        fVar9 = (float)uVar1 - (float)local_b0;
        fVar14 = (float)uVar2 - (float)((ulong)local_b0 >> 0x20);
        local_48 = CONCAT44(fVar14,fVar9);
        uStack_40 = 0;
        local_70 = local_b0;
        local_68 = local_a8;
        auVar12._0_8_ =
             sqrt((double)(ulong)(uint)(local_a0 * local_a0 + fVar9 * fVar9 + fVar14 * fVar14));
        auVar11._0_4_ = SUB84(auVar12._0_8_,0);
        local_5c = local_a0 / auVar11._0_4_;
        uVar13 = (undefined4)((ulong)auVar12._0_8_ >> 0x20);
        auVar12._8_4_ = uVar13;
        auVar12._12_4_ = uVar13;
        auVar11._8_8_ = auVar12._8_8_;
        auVar11._4_4_ = auVar11._0_4_;
        auVar16._8_8_ = uStack_40;
        auVar16._0_8_ = local_48;
        auVar16 = divps(auVar16,auVar11);
        local_64 = auVar16._0_8_;
        if ((this->shapes).m_size != 0) {
          uVar8 = 0;
          do {
            pSVar4 = (this->shapes).m_data[uVar8];
            iVar6 = (*pSVar4->_vptr_Shape[2])(pSVar4,&local_70);
            if ((char)iVar6 != '\0') goto LAB_00104a2f;
            uVar8 = uVar8 + 1;
          } while (uVar8 < (this->shapes).m_size);
        }
        local_88 = CONCAT44(local_88._4_4_ + (float)local_58,(float)local_88 + extraout_var);
        uStack_80 = CONCAT44(uStack_80._4_4_ + (float)local_58,(float)uStack_80 + (float)local_58);
        local_b4 = local_b4 + local_58._4_4_;
      }
LAB_00104a2f:
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->lights).m_size);
  }
  VVar17.z = local_b4;
  VVar17.x = (float)local_88;
  VVar17.y = local_88._4_4_;
  return VVar17;
}

Assistant:

constexpr Vec3 light_hit (Vec3 point, Vec3 normal) const
	{
		Vec3 attenuation = VEC3_ZERO;
		for (int i = 0; i < lights.size (); i++)
		{
			auto rec = lights.at (i)->visible (point, normal);
			if (rec.visible)
			{
				float distance = (lights.at (i)->position - point).length ();
				if (!intersects (lights.at (i)->ray_to_light (point), 0.001, distance))
				{
					attenuation += rec.attenuation;
				}
			}
		}
		return attenuation;
	}